

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void reveal_in_browser(Fl_Type *t)

{
  Fl_Type *local_18;
  Fl_Type *p;
  Fl_Type *t_local;
  
  local_18 = t->parent;
  if (local_18 != (Fl_Type *)0x0) {
    while( true ) {
      if (local_18->open_ == '\0') {
        local_18->open_ = '\x01';
      }
      if (local_18->parent == (Fl_Type *)0x0) break;
      local_18 = local_18->parent;
    }
    fixvisible(local_18);
  }
  Fl_Browser_::display(&widget_browser->super_Fl_Browser_,t);
  redraw_browser();
  return;
}

Assistant:

void reveal_in_browser(Fl_Type *t) {
  Fl_Type *p = t->parent;
  if (p) {
    for (;;) {
      if (!p->open_)
        p->open_ = 1;
      if (!p->parent) break;
      p = p->parent;
    }
    fixvisible(p);
  }
  widget_browser->display(t);
  redraw_browser();
}